

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_cursor.hpp
# Opt level: O1

void __thiscall
jsoncons::basic_json_cursor<char,_jsoncons::string_source<char>,_std::allocator<char>_>::read_next
          (basic_json_cursor<char,_jsoncons::string_source<char>,_std::allocator<char>_> *this,
          basic_json_visitor<char> *visitor,error_code *ec)

{
  parse_state pVar1;
  int iVar2;
  char_type *pcVar3;
  value_type *pvVar4;
  value_type *pvVar5;
  char_type *pcVar6;
  bool bVar7;
  span<const_char,_18446744073709551615UL> sVar8;
  
  (this->parser_).more_ = true;
  do {
    if ((this->parser_).input_ptr_ == (this->parser_).end_input_) {
      sVar8 = json_source_adaptor<jsoncons::string_source<char>_>::read_buffer(&this->source_,ec);
      pcVar6 = sVar8.data_;
      iVar2 = ec->_M_value;
      if (sVar8.size_ != 0 && iVar2 == 0) {
        (this->parser_).begin_input_ = pcVar6;
        (this->parser_).end_input_ = pcVar6 + sVar8.size_;
        (this->parser_).input_ptr_ = pcVar6;
      }
      if (iVar2 != 0) {
        return;
      }
    }
    pcVar6 = (this->parser_).input_ptr_;
    pcVar3 = (this->parser_).end_input_;
    pvVar4 = (this->source_).source_.end_;
    pvVar5 = (this->source_).source_.current_;
    basic_json_parser<char,_std::allocator<char>_>::parse_some_(&this->parser_,visitor,ec);
    bVar7 = ec->_M_value != 0;
    if ((pvVar4 == pvVar5 && pcVar6 == pcVar3) && !bVar7) {
      pVar1 = (this->parser_).state_;
      if (pVar1 == start) {
        this->done_ = true;
      }
      else {
        bVar7 = false;
        if ((pVar1 == accept) || (((this->parser_).done_ & 1U) != 0)) goto LAB_00564a76;
        std::error_code::operator=(ec,unexpected_eof);
      }
      bVar7 = true;
    }
LAB_00564a76:
    if (bVar7) {
      return;
    }
    if (((this->parser_).more_ & 1U) == 0) {
      return;
    }
  } while( true );
}

Assistant:

void read_next(basic_json_visitor<CharT>& visitor, std::error_code& ec)
    {
        parser_.restart();
        while (!parser_.stopped())
        {
            if (parser_.source_exhausted())
            {
                auto s = source_.read_buffer(ec);
                if (JSONCONS_UNLIKELY(ec)) {return;}
                if (s.size() > 0)
                {
                    parser_.update(s.data(),s.size());
                    if (JSONCONS_UNLIKELY(ec)) {return;}
                }
            }
            bool eof = parser_.source_exhausted() && source_.eof();
            parser_.parse_some(visitor, ec);
            if (JSONCONS_UNLIKELY(ec)) {return;}
            if (eof)
            {
                if (parser_.enter())
                {
                    done_ = true;
                    break;
                }
                else if (!parser_.accept())
                {
                    ec = json_errc::unexpected_eof;
                    return;
                }
            }
        }
    }